

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomDetailView.cpp
# Opt level: O3

void __thiscall RoomDetailView::display(RoomDetailView *this)

{
  bool bVar1;
  int iVar2;
  Room *this_00;
  ostream *poVar3;
  Controller *this_01;
  View *pVVar4;
  long lVar5;
  char *pcVar6;
  string sStack_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter room number to get details for: \n",0x27);
  iVar2 = Input::getInt();
  this_00 = Room::findByRoomNumber(iVar2);
  if (this_00 == (Room *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Room #",6);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," doesn\'t exist.\n",0x10);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Details for room #",0x12);
    iVar2 = Room::getRoomNumber(this_00);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\tStrength: ",0xc);
    iVar2 = Room::getStrength(this_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\tAudio: ",9);
    bVar1 = Room::hasVideo(this_00);
    if (bVar1) {
      pcVar6 = "Yes";
      lVar5 = 3;
    }
    else {
      pcVar6 = "No";
      lVar5 = 2;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\tVideo: ",9);
    bVar1 = Room::hasVideo(this_00);
    if (bVar1) {
      pcVar6 = "Yes";
      lVar5 = 3;
    }
    else {
      pcVar6 = "No";
      lVar5 = 2;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  this_01 = Controller::getInstance();
  sStack_40._M_dataplus._M_p = (pointer)&sStack_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_40,"admin-panel","");
  pVVar4 = Controller::getView(this_01,&sStack_40);
  View::response->view = pVVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_40._M_dataplus._M_p != &sStack_40.field_2) {
    operator_delete(sStack_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RoomDetailView::display() {
    cout << "Enter room number to get details for: \n";
    int roomNumber = Input::getInt();
    Room *room = Room::findByRoomNumber(roomNumber);
    if (room) {
        cout << "Details for room #" << room->getRoomNumber() << "\n\tStrength: " << room->getStrength()
             << "\n\tAudio: ";
        if (room->hasVideo()) cout << "Yes"; else cout << "No";
        cout << "\n\tVideo: ";
        if (room->hasVideo()) cout << "Yes"; else cout << "No";
        cout << endl;
    } else {
        cout << "Room #" << roomNumber << " doesn't exist.\n";
    }
    response->view = Controller::getInstance().getView("admin-panel");
}